

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  OfType OVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_type sVar18;
  int iVar19;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar20;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  ReusableStringStream local_90;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char *local_48;
  size_t local_40;
  OfType local_38;
  uint local_34;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0019fc10;
  uVar7 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_start + 4);
  sVar4 = (_assertionResult->m_info).macroName.m_size;
  uVar8 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_size + 4);
  uVar9 = *(undefined4 *)&(_assertionResult->m_info).lineInfo.file;
  uVar10 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.file + 4);
  sVar6 = (_assertionResult->m_info).lineInfo.line;
  uVar11 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.line + 4);
  uVar12 = *(undefined4 *)&(_assertionResult->m_info).capturedExpression.m_start;
  uVar13 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_start + 4);
  sVar18 = (_assertionResult->m_info).capturedExpression.m_size;
  uVar14 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start =
       *(undefined4 *)&(_assertionResult->m_info).macroName.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar7;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar4;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar8;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar9;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar10;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar6;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar11;
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start = uVar12;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar13;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar18;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar14;
  uVar7 = *(undefined4 *)&(_assertionResult->m_info).field_0x34;
  (this->assertionResult).m_info.resultDisposition = (_assertionResult->m_info).resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar7;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar2 = (_assertionResult->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar2 = (_assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).reconstructedExpression._M_string_length);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (ITransientExpression *)0x0;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated =
       (_assertionResult->m_resultData).lazyExpression.m_isNegated;
  (this->assertionResult).m_resultData.resultType = (_assertionResult->m_resultData).resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar19 = _totals->error;
  uVar7 = *(undefined4 *)&_totals->field_0x4;
  sVar6 = (_totals->assertions).passed;
  sVar15 = (_totals->assertions).failed;
  sVar16 = (_totals->assertions).failedButOk;
  sVar17 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar17;
  (this->totals).assertions.failed = sVar15;
  (this->totals).assertions.failedButOk = sVar16;
  (this->totals).error = iVar19;
  *(undefined4 *)&(this->totals).field_0x4 = uVar7;
  (this->totals).assertions.passed = sVar6;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    pcVar3 = (this->assertionResult).m_info.macroName.m_start;
    sVar4 = (this->assertionResult).m_info.macroName.m_size;
    pcVar5 = (this->assertionResult).m_info.lineInfo.file;
    sVar6 = (this->assertionResult).m_info.lineInfo.line;
    OVar1 = (this->assertionResult).m_resultData.resultType;
    local_90.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001a0198
    ;
    pSVar20 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    local_90.m_index = StringStreams::add(&pSVar20->super_StringStreams);
    pSVar20 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    local_90.m_oss =
         *(ostream **)
          &(pSVar20->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_90.m_index]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    MessageInfo::globalCount = MessageInfo::globalCount + 1;
    pcVar2 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0 = local_a0;
    local_78._0_8_ = pcVar3;
    local_78._8_8_ = sVar4;
    local_68._M_p = (pointer)&local_58;
    local_48 = pcVar5;
    local_40 = sVar6;
    local_38 = OVar1;
    local_34 = MessageInfo::globalCount;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,
               pcVar2 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_90.m_oss,local_b0,local_a8);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_b0);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p);
    }
    ReusableStringStream::~ReusableStringStream(&local_90);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }